

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool pegmatite::parse(Input *i,Rule *g,Rule *ws,ErrorReporter *err,ParserDelegate *delegate,void *d)

{
  bool bVar1;
  undefined1 local_130 [8];
  Context con;
  void *d_local;
  ParserDelegate *delegate_local;
  ErrorReporter *err_local;
  Rule *ws_local;
  Rule *g_local;
  Input *i_local;
  
  con.cache._M_h._M_single_bucket = (__node_base_ptr)d;
  Context::Context((Context *)local_130,i,ws,delegate);
  Context::parse_term((Context *)local_130,(Rule *)local_130);
  bVar1 = Context::parse_non_term((Context *)local_130,g);
  if (bVar1) {
    Context::parse_term((Context *)local_130,(Rule *)local_130);
    bVar1 = Context::end((Context *)local_130);
    if (bVar1) {
      Context::clear_cache((Context *)local_130);
      i_local._7_1_ = Context::do_parse_procs((Context *)local_130,con.cache._M_h._M_single_bucket);
    }
    else {
      bVar1 = Input::iterator::operator<((iterator *)&con.position.line,(iterator *)&con.start.idx);
      if (bVar1) {
        _syntax_Error(err,(Context *)local_130);
      }
      else {
        _eof_Error(err,(Context *)local_130);
      }
      i_local._7_1_ = false;
    }
  }
  else {
    _syntax_Error(err,(Context *)local_130);
    i_local._7_1_ = false;
  }
  Context::~Context((Context *)local_130);
  return i_local._7_1_;
}

Assistant:

bool parse(Input &i, const Rule &g, const Rule &ws, ErrorReporter &err,
           const ParserDelegate &delegate, void *d)
{
	//prepare context
	Context con(i, ws, delegate);

	//parse initial whitespace
	con.parse_term(con.whitespace_rule);

	//parse grammar
	if (!con.parse_non_term(g))
	{
		_syntax_Error(err, con);
		return false;
	}

	//parse whitespace at the end
	con.parse_term(con.whitespace_rule);

	//if end is not reached, there was an error
	if (!con.end())
	{
		if (con.error_pos.it < con.finish)
		{
			_syntax_Error(err, con);
		}
		else
		{
			_eof_Error(err, con);
		}
		return false;
	}

	con.clear_cache();

	//success; execute the parse procedures
	return con.do_parse_procs(d);
}